

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  size_t __n;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  ulong local_b8;
  
  uVar32 = (ulong)((uint)hash->bytes & 0x3f);
  hash->bytes = hash->bytes + len;
  local_b8 = uVar32;
  if (0x3f < uVar32 + len) {
    local_b8 = 0;
    do {
      __n = 0x40 - uVar32;
      memcpy((void *)((long)hash->buf + uVar32),data,__n);
      data = data + __n;
      len = len - __n;
      uVar1 = hash->s[0];
      uVar2 = hash->s[1];
      uVar3 = hash->s[2];
      uVar4 = hash->s[3];
      uVar5 = hash->s[4];
      uVar6 = hash->s[5];
      uVar7 = hash->s[6];
      uVar8 = hash->s[7];
      uVar61 = hash->buf[0];
      uVar11 = uVar61 >> 0x18 | (uVar61 & 0xff0000) >> 8 | (uVar61 & 0xff00) << 8 | uVar61 << 0x18;
      iVar9 = ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + uVar8 +
              ((uVar5 << 7 | uVar5 >> 0x19) ^
              (uVar5 << 0x15 | uVar5 >> 0xb) ^ (uVar5 << 0x1a | uVar5 >> 6));
      uVar10 = ((uVar2 | uVar1) & uVar3 | uVar2 & uVar1) +
               ((uVar1 << 10 | uVar1 >> 0x16) ^
               (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
               uVar11 + iVar9 + 0x428a2f98;
      uVar12 = uVar4 + iVar9 + uVar11 + 0x428a2f98;
      uVar61 = hash->buf[1];
      uVar15 = uVar61 >> 0x18 | (uVar61 & 0xff0000) >> 8 | (uVar61 & 0xff00) << 8;
      uVar28 = uVar15 | uVar61 << 0x18;
      iVar9 = ((uVar6 ^ uVar5) & uVar12 ^ uVar6) + uVar28 + uVar7;
      uVar33 = (uVar12 * 0x80 | uVar12 >> 0x19) ^
               (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6);
      uVar29 = iVar9 + uVar33 + uVar3 + 0x71374491;
      uVar14 = ((uVar10 | uVar1) & uVar2 | uVar10 & uVar1) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) +
               iVar9 + uVar33 + 0x71374491;
      uVar33 = hash->buf[2];
      uVar27 = uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8;
      uVar42 = uVar27 | uVar33 << 0x18;
      iVar9 = ((uVar12 ^ uVar5) & uVar29 ^ uVar5) + uVar42 + uVar6;
      uVar43 = (uVar29 * 0x80 | uVar29 >> 0x19) ^
               (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6);
      uVar34 = uVar2 + iVar9 + uVar43 + 0xb5c0fbcf;
      uVar23 = ((uVar14 | uVar10) & uVar1 | uVar14 & uVar10) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) +
               uVar43 + iVar9 + -0x4a3f0431;
      uVar44 = (uVar34 * 0x80 | uVar34 >> 0x19) ^
               (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6);
      uVar43 = hash->buf[3];
      uVar31 = uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8;
      uVar49 = uVar31 | uVar43 << 0x18;
      iVar9 = ((uVar29 ^ uVar12) & uVar34 ^ uVar12) + uVar49 + uVar5;
      uVar45 = ((uVar23 | uVar14) & uVar10 | uVar23 & uVar14) +
               ((uVar23 * 0x400 | uVar23 >> 0x16) ^
               (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) +
               iVar9 + uVar44 + -0x164a245b;
      uVar60 = iVar9 + uVar44 + uVar1 + 0xe9b5dba5;
      uVar44 = hash->buf[4];
      uVar41 = uVar44 >> 0x18 | (uVar44 & 0xff0000) >> 8 | (uVar44 & 0xff00) << 8;
      uVar16 = uVar41 | uVar44 << 0x18;
      iVar9 = uVar12 + uVar16 + ((uVar34 ^ uVar29) & uVar60 ^ uVar29) +
              ((uVar60 * 0x80 | uVar60 >> 0x19) ^
              (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6)) + 0x3956c25b
      ;
      uVar10 = uVar10 + iVar9;
      uVar46 = ((uVar45 | uVar23) & uVar14 | uVar45 & uVar23) +
               ((uVar45 * 0x400 | uVar45 >> 0x16) ^
               (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar9;
      uVar12 = hash->buf[5];
      uVar48 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8;
      uVar17 = uVar48 | uVar12 << 0x18;
      iVar9 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
              (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
              uVar29 + uVar17 + ((uVar60 ^ uVar34) & uVar10 ^ uVar34) + 0x59f111f1;
      uVar14 = uVar14 + iVar9;
      uVar50 = ((uVar46 | uVar45) & uVar23 | uVar46 & uVar45) +
               ((uVar46 * 0x400 | uVar46 >> 0x16) ^
               (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar9;
      uVar29 = hash->buf[6];
      uVar51 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8;
      uVar18 = uVar51 | uVar29 << 0x18;
      iVar9 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
              (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
              uVar34 + uVar18 + ((uVar10 ^ uVar60) & uVar14 ^ uVar60) + -0x6dc07d5c;
      uVar23 = uVar23 + iVar9;
      uVar19 = ((uVar50 | uVar46) & uVar45 | uVar50 & uVar46) +
               ((uVar50 * 0x400 | uVar50 >> 0x16) ^
               (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar9;
      uVar34 = hash->buf[7];
      uVar52 = uVar34 >> 0x18 | (uVar34 & 0xff0000) >> 8 | (uVar34 & 0xff00) << 8;
      uVar35 = uVar52 | uVar34 << 0x18;
      iVar9 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
              (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
              uVar60 + uVar35 + ((uVar14 ^ uVar10) & uVar23 ^ uVar10) + -0x54e3a12b;
      uVar45 = uVar45 + iVar9;
      uVar30 = ((uVar19 | uVar50) & uVar46 | uVar19 & uVar50) +
               ((uVar19 * 0x400 | uVar19 >> 0x16) ^
               (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar9;
      uVar60 = hash->buf[8];
      uVar53 = uVar60 >> 0x18 | (uVar60 & 0xff0000) >> 8 | (uVar60 & 0xff00) << 8;
      uVar21 = uVar53 | uVar60 << 0x18;
      iVar9 = uVar10 + uVar21 + ((uVar23 ^ uVar14) & uVar45 ^ uVar14) +
              ((uVar45 * 0x80 | uVar45 >> 0x19) ^
              (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) +
              -0x27f85568;
      uVar46 = uVar46 + iVar9;
      uVar13 = ((uVar30 | uVar19) & uVar50 | uVar30 & uVar19) +
               ((uVar30 * 0x400 | uVar30 >> 0x16) ^
               (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar9;
      uVar10 = hash->buf[9];
      uVar54 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8;
      uVar22 = uVar54 | uVar10 << 0x18;
      iVar9 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
              (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
              uVar14 + uVar22 + ((uVar45 ^ uVar23) & uVar46 ^ uVar23) + 0x12835b01;
      uVar50 = uVar50 + iVar9;
      uVar55 = ((uVar13 | uVar30) & uVar19 | uVar13 & uVar30) +
               ((uVar13 * 0x400 | uVar13 >> 0x16) ^
               (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar9;
      uVar14 = hash->buf[10];
      uVar56 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8;
      uVar36 = uVar56 | uVar14 << 0x18;
      iVar9 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
              (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
              uVar23 + uVar36 + ((uVar46 ^ uVar45) & uVar50 ^ uVar45) + 0x243185be;
      uVar19 = uVar19 + iVar9;
      uVar37 = ((uVar55 | uVar13) & uVar30 | uVar55 & uVar13) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar9;
      uVar23 = hash->buf[0xb];
      uVar57 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8;
      uVar24 = uVar57 | uVar23 << 0x18;
      iVar9 = ((uVar19 * 0x80 | uVar19 >> 0x19) ^
              (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) +
              uVar45 + uVar24 + ((uVar50 ^ uVar46) & uVar19 ^ uVar46) + 0x550c7dc3;
      uVar30 = uVar30 + iVar9;
      uVar38 = ((uVar37 | uVar55) & uVar13 | uVar37 & uVar55) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar9;
      uVar45 = hash->buf[0xc];
      uVar58 = uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 | (uVar45 & 0xff00) << 8;
      uVar25 = uVar58 | uVar45 << 0x18;
      iVar9 = ((uVar30 * 0x80 | uVar30 >> 0x19) ^
              (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) +
              uVar46 + uVar25 + ((uVar19 ^ uVar50) & uVar30 ^ uVar50) + 0x72be5d74;
      uVar13 = uVar13 + iVar9;
      uVar47 = ((uVar38 | uVar37) & uVar55 | uVar38 & uVar37) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar9;
      uVar46 = hash->buf[0xd];
      uVar59 = uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8;
      uVar26 = uVar59 | uVar46 << 0x18;
      iVar9 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
              (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
              uVar50 + uVar26 + ((uVar30 ^ uVar19) & uVar13 ^ uVar19) + -0x7f214e02;
      uVar55 = uVar55 + iVar9;
      uVar39 = ((uVar47 | uVar38) & uVar37 | uVar47 & uVar38) +
               ((uVar47 * 0x400 | uVar47 >> 0x16) ^
               (uVar47 * 0x80000 | uVar47 >> 0xd) ^ (uVar47 * 0x40000000 | uVar47 >> 2)) + iVar9;
      uVar50 = hash->buf[0xe];
      uVar62 = uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8;
      uVar63 = uVar62 | uVar50 << 0x18;
      iVar9 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
              (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
              uVar19 + uVar63 + ((uVar13 ^ uVar30) & uVar55 ^ uVar30) + -0x6423f959;
      uVar37 = uVar37 + iVar9;
      uVar40 = ((uVar39 | uVar47) & uVar38 | uVar39 & uVar47) +
               ((uVar39 * 0x400 | uVar39 >> 0x16) ^
               (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar9;
      uVar19 = hash->buf[0xf];
      uVar65 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8;
      uVar20 = uVar65 | uVar19 << 0x18;
      iVar9 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
              (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
              uVar30 + uVar20 + ((uVar55 ^ uVar13) & uVar37 ^ uVar13) + -0x3e640e8c;
      uVar38 = uVar38 + iVar9;
      uVar30 = ((uVar40 | uVar39) & uVar47 | uVar40 & uVar39) +
               ((uVar40 * 0x400 | uVar40 >> 0x16) ^
               (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar9;
      uVar15 = uVar11 + uVar22 +
               (uVar28 >> 3 ^
               (uVar15 << 0xe | uVar28 >> 0x12) ^ ((uVar61 >> 0x18) << 0x19 | uVar28 >> 7)) +
               (uVar63 >> 10 ^ (uVar62 << 0xd | uVar63 >> 0x13) ^ (uVar62 << 0xf | uVar63 >> 0x11));
      iVar9 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
              (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
              uVar13 + uVar15 + ((uVar37 ^ uVar55) & uVar38 ^ uVar55) + -0x1b64963f;
      uVar47 = uVar47 + iVar9;
      uVar11 = ((uVar30 | uVar40) & uVar39 | uVar30 & uVar40) +
               ((uVar30 * 0x400 | uVar30 >> 0x16) ^
               (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar9;
      uVar64 = uVar28 + uVar36 +
               (uVar42 >> 3 ^
               (uVar27 << 0xe | uVar42 >> 0x12) ^ ((uVar33 >> 0x18) << 0x19 | uVar42 >> 7)) +
               (uVar20 >> 10 ^ (uVar65 << 0xd | uVar20 >> 0x13) ^ (uVar65 << 0xf | uVar20 >> 0x11));
      iVar9 = ((uVar47 * 0x80 | uVar47 >> 0x19) ^
              (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6)) +
              uVar55 + uVar64 + ((uVar38 ^ uVar37) & uVar47 ^ uVar37) + -0x1041b87a;
      uVar39 = uVar39 + iVar9;
      uVar61 = ((uVar11 | uVar30) & uVar40 | uVar11 & uVar30) +
               ((uVar11 * 0x400 | uVar11 >> 0x16) ^
               (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar9;
      uVar13 = uVar42 + uVar24 +
               (uVar49 >> 3 ^
               (uVar31 << 0xe | uVar49 >> 0x12) ^ ((uVar43 >> 0x18) << 0x19 | uVar49 >> 7)) +
               (uVar15 >> 10 ^
               (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11));
      iVar9 = ((uVar39 * 0x80 | uVar39 >> 0x19) ^
              (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
              uVar37 + uVar13 + ((uVar47 ^ uVar38) & uVar39 ^ uVar38) + 0xfc19dc6;
      uVar40 = uVar40 + iVar9;
      uVar28 = ((uVar61 | uVar11) & uVar30 | uVar61 & uVar11) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar9;
      uVar37 = uVar49 + uVar25 +
               (uVar16 >> 3 ^
               (uVar41 << 0xe | uVar16 >> 0x12) ^ ((uVar44 >> 0x18) << 0x19 | uVar16 >> 7)) +
               (uVar64 >> 10 ^
               (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
      iVar9 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
              (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
              uVar38 + uVar37 + ((uVar39 ^ uVar47) & uVar40 ^ uVar47) + 0x240ca1cc;
      uVar30 = uVar30 + iVar9;
      uVar43 = ((uVar28 | uVar61) & uVar11 | uVar28 & uVar61) +
               ((uVar28 * 0x400 | uVar28 >> 0x16) ^
               (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar9;
      uVar48 = uVar16 + uVar26 +
               (uVar17 >> 3 ^
               (uVar48 << 0xe | uVar17 >> 0x12) ^ ((uVar12 >> 0x18) << 0x19 | uVar17 >> 7)) +
               (uVar13 >> 10 ^
               (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
      iVar9 = ((uVar30 * 0x80 | uVar30 >> 0x19) ^
              (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) +
              uVar47 + uVar48 + ((uVar40 ^ uVar39) & uVar30 ^ uVar39) + 0x2de92c6f;
      uVar11 = uVar11 + iVar9;
      uVar16 = ((uVar43 | uVar28) & uVar61 | uVar43 & uVar28) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar9;
      uVar51 = uVar17 + uVar63 +
               (uVar18 >> 3 ^
               (uVar51 << 0xe | uVar18 >> 0x12) ^ ((uVar29 >> 0x18) << 0x19 | uVar18 >> 7)) +
               (uVar37 >> 10 ^
               (uVar37 * 0x2000 | uVar37 >> 0x13) ^ (uVar37 * 0x8000 | uVar37 >> 0x11));
      iVar9 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
              (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
              uVar39 + uVar51 + ((uVar30 ^ uVar40) & uVar11 ^ uVar40) + 0x4a7484aa;
      uVar61 = uVar61 + iVar9;
      uVar31 = ((uVar16 | uVar43) & uVar28 | uVar16 & uVar43) +
               ((uVar16 * 0x400 | uVar16 >> 0x16) ^
               (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar9;
      uVar29 = uVar18 + uVar20 +
               (uVar35 >> 3 ^
               (uVar52 << 0xe | uVar35 >> 0x12) ^ ((uVar34 >> 0x18) << 0x19 | uVar35 >> 7)) +
               (uVar48 >> 10 ^
               (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
      iVar9 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
              (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
              uVar40 + uVar29 + ((uVar11 ^ uVar30) & uVar61 ^ uVar30) + 0x5cb0a9dc;
      uVar28 = uVar28 + iVar9;
      uVar12 = ((uVar31 | uVar16) & uVar43 | uVar31 & uVar16) +
               ((uVar31 * 0x400 | uVar31 >> 0x16) ^
               (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar9;
      uVar33 = (uVar21 >> 3 ^
               (uVar53 << 0xe | uVar21 >> 0x12) ^ ((uVar60 >> 0x18) << 0x19 | uVar21 >> 7)) + uVar35
               + uVar15 +
               (uVar51 >> 10 ^
               (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
      iVar9 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
              (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
              uVar30 + uVar33 + ((uVar61 ^ uVar11) & uVar28 ^ uVar11) + 0x76f988da;
      uVar43 = uVar43 + iVar9;
      uVar27 = ((uVar12 | uVar31) & uVar16 | uVar12 & uVar31) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar9;
      uVar44 = (uVar22 >> 3 ^
               (uVar54 << 0xe | uVar22 >> 0x12) ^ ((uVar10 >> 0x18) << 0x19 | uVar22 >> 7)) + uVar21
               + uVar64 +
               (uVar29 >> 10 ^
               (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11));
      iVar9 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
              (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
              uVar11 + uVar44 + ((uVar28 ^ uVar61) & uVar43 ^ uVar61) + -0x67c1aeae;
      uVar16 = uVar16 + iVar9;
      uVar41 = ((uVar27 | uVar12) & uVar31 | uVar27 & uVar12) +
               ((uVar27 * 0x400 | uVar27 >> 0x16) ^
               (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar9;
      uVar56 = (uVar36 >> 3 ^
               (uVar56 << 0xe | uVar36 >> 0x12) ^ ((uVar14 >> 0x18) << 0x19 | uVar36 >> 7)) + uVar22
               + uVar13 +
               (uVar33 >> 10 ^
               (uVar33 * 0x2000 | uVar33 >> 0x13) ^ (uVar33 * 0x8000 | uVar33 >> 0x11));
      iVar9 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
              (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
              uVar61 + uVar56 + ((uVar43 ^ uVar28) & uVar16 ^ uVar28) + -0x57ce3993;
      uVar31 = uVar31 + iVar9;
      uVar34 = ((uVar41 | uVar27) & uVar12 | uVar41 & uVar27) +
               ((uVar41 * 0x400 | uVar41 >> 0x16) ^
               (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar9;
      uVar52 = (uVar24 >> 3 ^
               (uVar57 << 0xe | uVar24 >> 0x12) ^ ((uVar23 >> 0x18) << 0x19 | uVar24 >> 7)) + uVar36
               + uVar37 +
               (uVar44 >> 10 ^
               (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11));
      iVar9 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
              (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
              uVar28 + uVar52 + ((uVar16 ^ uVar43) & uVar31 ^ uVar43) + -0x4ffcd838;
      uVar12 = uVar12 + iVar9;
      uVar61 = ((uVar34 | uVar41) & uVar27 | uVar34 & uVar41) +
               ((uVar34 * 0x400 | uVar34 >> 0x16) ^
               (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar9;
      uVar57 = (uVar25 >> 3 ^
               (uVar58 << 0xe | uVar25 >> 0x12) ^ ((uVar45 >> 0x18) << 0x19 | uVar25 >> 7)) + uVar24
               + uVar48 +
               (uVar56 >> 10 ^
               (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
      iVar9 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
              (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
              uVar43 + uVar57 + ((uVar31 ^ uVar16) & uVar12 ^ uVar16) + -0x40a68039;
      uVar27 = uVar27 + iVar9;
      uVar23 = ((uVar61 | uVar34) & uVar41 | uVar61 & uVar34) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar9;
      uVar46 = (uVar26 >> 3 ^
               (uVar59 << 0xe | uVar26 >> 0x12) ^ ((uVar46 >> 0x18) << 0x19 | uVar26 >> 7)) + uVar25
               + uVar51 +
               (uVar52 >> 10 ^
               (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11));
      iVar9 = uVar16 + uVar46 + ((uVar12 ^ uVar31) & uVar27 ^ uVar31) +
              ((uVar27 * 0x80 | uVar27 >> 0x19) ^
              (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) +
              -0x391ff40d;
      uVar41 = uVar41 + iVar9;
      uVar43 = ((uVar23 | uVar61) & uVar34 | uVar23 & uVar61) +
               ((uVar23 * 0x400 | uVar23 >> 0x16) ^
               (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar9;
      uVar58 = (uVar63 >> 3 ^
               (uVar62 << 0xe | uVar63 >> 0x12) ^ ((uVar50 >> 0x18) << 0x19 | uVar63 >> 7)) + uVar26
               + uVar29 +
               (uVar57 >> 10 ^
               (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
      iVar9 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
              (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
              uVar31 + uVar58 + ((uVar27 ^ uVar12) & uVar41 ^ uVar12) + -0x2a586eb9;
      uVar34 = uVar34 + iVar9;
      uVar10 = ((uVar43 | uVar23) & uVar61 | uVar43 & uVar23) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar9;
      uVar50 = (uVar20 >> 3 ^
               (uVar65 << 0xe | uVar20 >> 0x12) ^ ((uVar19 >> 0x18) << 0x19 | uVar20 >> 7)) + uVar63
               + uVar33 +
               (uVar46 >> 10 ^
               (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
      iVar9 = ((uVar34 * 0x80 | uVar34 >> 0x19) ^
              (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) +
              uVar12 + uVar50 + ((uVar41 ^ uVar27) & uVar34 ^ uVar27) + 0x6ca6351;
      uVar61 = uVar61 + iVar9;
      uVar14 = ((uVar10 | uVar43) & uVar23 | uVar10 & uVar43) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar9;
      uVar60 = (uVar15 >> 3 ^
               (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7)) + uVar20 +
               uVar44 + (uVar58 >> 10 ^
                        (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
      iVar9 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
              (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
              uVar27 + uVar60 + ((uVar34 ^ uVar41) & uVar61 ^ uVar41) + 0x14292967;
      uVar23 = uVar23 + iVar9;
      uVar31 = ((uVar14 | uVar10) & uVar43 | uVar14 & uVar10) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar9;
      uVar19 = (uVar64 >> 3 ^
               (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7)) + uVar15 +
               uVar56 + (uVar50 >> 10 ^
                        (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
      iVar9 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
              (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
              uVar41 + uVar19 + ((uVar61 ^ uVar34) & uVar23 ^ uVar34) + 0x27b70a85;
      uVar43 = uVar43 + iVar9;
      uVar27 = ((uVar31 | uVar14) & uVar10 | uVar31 & uVar14) +
               ((uVar31 * 0x400 | uVar31 >> 0x16) ^
               (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar9;
      uVar15 = (uVar13 >> 3 ^
               (uVar13 * 0x4000 | uVar13 >> 0x12) ^ (uVar13 * 0x2000000 | uVar13 >> 7)) + uVar64 +
               uVar52 + (uVar60 >> 10 ^
                        (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
      iVar9 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
              (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
              uVar34 + uVar15 + ((uVar23 ^ uVar61) & uVar43 ^ uVar61) + 0x2e1b2138;
      uVar10 = uVar10 + iVar9;
      uVar12 = ((uVar27 | uVar31) & uVar14 | uVar27 & uVar31) +
               ((uVar27 * 0x400 | uVar27 >> 0x16) ^
               (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar9;
      uVar34 = (uVar37 >> 3 ^
               (uVar37 * 0x4000 | uVar37 >> 0x12) ^ (uVar37 * 0x2000000 | uVar37 >> 7)) + uVar13 +
               uVar57 + (uVar19 >> 10 ^
                        (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
      iVar9 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
              (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
              uVar61 + uVar34 + ((uVar43 ^ uVar23) & uVar10 ^ uVar23) + 0x4d2c6dfc;
      uVar14 = uVar14 + iVar9;
      uVar45 = ((uVar12 | uVar27) & uVar31 | uVar12 & uVar27) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar9;
      uVar41 = (uVar48 >> 3 ^
               (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7)) + uVar37 +
               uVar46 + (uVar15 >> 10 ^
                        (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11));
      iVar9 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
              (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
              uVar23 + uVar41 + ((uVar10 ^ uVar43) & uVar14 ^ uVar43) + 0x53380d13;
      uVar31 = uVar31 + iVar9;
      uVar61 = ((uVar45 | uVar12) & uVar27 | uVar45 & uVar12) +
               ((uVar45 * 0x400 | uVar45 >> 0x16) ^
               (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar9;
      uVar48 = (uVar51 >> 3 ^
               (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7)) + uVar48 +
               uVar58 + (uVar34 >> 10 ^
                        (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
      iVar9 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
              (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
              uVar43 + uVar48 + ((uVar14 ^ uVar10) & uVar31 ^ uVar10) + 0x650a7354;
      uVar27 = uVar27 + iVar9;
      uVar43 = ((uVar61 | uVar45) & uVar12 | uVar61 & uVar45) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar9;
      uVar51 = (uVar29 >> 3 ^
               (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7)) + uVar51 +
               uVar50 + (uVar41 >> 10 ^
                        (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11));
      iVar9 = uVar10 + uVar51 + ((uVar31 ^ uVar14) & uVar27 ^ uVar14) +
              ((uVar27 * 0x80 | uVar27 >> 0x19) ^
              (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) + 0x766a0abb
      ;
      uVar12 = uVar12 + iVar9;
      uVar23 = ((uVar43 | uVar61) & uVar45 | uVar43 & uVar61) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar9;
      uVar29 = (uVar33 >> 3 ^
               (uVar33 * 0x4000 | uVar33 >> 0x12) ^ (uVar33 * 0x2000000 | uVar33 >> 7)) + uVar29 +
               uVar60 + (uVar48 >> 10 ^
                        (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
      iVar9 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
              (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
              uVar14 + uVar29 + ((uVar27 ^ uVar31) & uVar12 ^ uVar31) + -0x7e3d36d2;
      uVar45 = uVar45 + iVar9;
      uVar65 = ((uVar23 | uVar43) & uVar61 | uVar23 & uVar43) +
               ((uVar23 * 0x400 | uVar23 >> 0x16) ^
               (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar9;
      uVar53 = (uVar44 >> 3 ^
               (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7)) + uVar33 +
               uVar19 + (uVar51 >> 10 ^
                        (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
      iVar9 = ((uVar45 * 0x80 | uVar45 >> 0x19) ^
              (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) +
              uVar31 + uVar53 + ((uVar12 ^ uVar27) & uVar45 ^ uVar27) + -0x6d8dd37b;
      uVar61 = uVar61 + iVar9;
      uVar33 = ((uVar65 | uVar23) & uVar43 | uVar65 & uVar23) +
               ((uVar65 * 0x400 | uVar65 >> 0x16) ^
               (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar9;
      uVar54 = (uVar56 >> 3 ^
               (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) + uVar44 +
               uVar15 + (uVar29 >> 10 ^
                        (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11));
      iVar9 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
              (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
              uVar27 + uVar54 + ((uVar45 ^ uVar12) & uVar61 ^ uVar12) + -0x5d40175f;
      uVar43 = uVar43 + iVar9;
      uVar62 = ((uVar33 | uVar65) & uVar23 | uVar33 & uVar65) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar9;
      uVar56 = (uVar52 >> 3 ^
               (uVar52 * 0x4000 | uVar52 >> 0x12) ^ (uVar52 * 0x2000000 | uVar52 >> 7)) + uVar56 +
               uVar34 + (uVar53 >> 10 ^
                        (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11));
      iVar9 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
              (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
              uVar12 + uVar56 + ((uVar61 ^ uVar45) & uVar43 ^ uVar45) + -0x57e599b5;
      uVar23 = uVar23 + iVar9;
      uVar59 = ((uVar62 | uVar33) & uVar65 | uVar62 & uVar33) +
               ((uVar62 * 0x400 | uVar62 >> 0x16) ^
               (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar9;
      uVar10 = (uVar57 >> 3 ^
               (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7)) + uVar52 +
               uVar41 + (uVar54 >> 10 ^
                        (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11));
      iVar9 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
              (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
              uVar45 + uVar10 + ((uVar43 ^ uVar61) & uVar23 ^ uVar61) + -0x3db47490;
      uVar65 = uVar65 + iVar9;
      uVar12 = ((uVar59 | uVar62) & uVar33 | uVar59 & uVar62) +
               ((uVar59 * 0x400 | uVar59 >> 0x16) ^
               (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar9;
      uVar14 = (uVar46 >> 3 ^
               (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) + uVar57 +
               uVar48 + (uVar56 >> 10 ^
                        (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
      iVar9 = uVar61 + uVar14 + ((uVar23 ^ uVar43) & uVar65 ^ uVar43) +
              ((uVar65 * 0x80 | uVar65 >> 0x19) ^
              (uVar65 * 0x200000 | uVar65 >> 0xb) ^ (uVar65 * 0x4000000 | uVar65 >> 6)) +
              -0x3893ae5d;
      uVar33 = uVar33 + iVar9;
      uVar52 = ((uVar12 | uVar59) & uVar62 | uVar12 & uVar59) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar9;
      uVar45 = (uVar58 >> 3 ^
               (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7)) + uVar46 +
               uVar51 + (uVar10 >> 10 ^
                        (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
      iVar9 = uVar43 + uVar45 + ((uVar65 ^ uVar23) & uVar33 ^ uVar23) +
              ((uVar33 * 0x80 | uVar33 >> 0x19) ^
              (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
              -0x2e6d17e7;
      uVar62 = uVar62 + iVar9;
      uVar61 = ((uVar52 | uVar12) & uVar59 | uVar52 & uVar12) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar9;
      uVar46 = (uVar50 >> 3 ^
               (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7)) + uVar58 +
               uVar29 + (uVar14 >> 10 ^
                        (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11));
      iVar9 = ((uVar62 * 0x80 | uVar62 >> 0x19) ^
              (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6)) +
              uVar23 + uVar46 + ((uVar33 ^ uVar65) & uVar62 ^ uVar65) + -0x2966f9dc;
      uVar59 = uVar59 + iVar9;
      uVar27 = ((uVar61 | uVar52) & uVar12 | uVar61 & uVar52) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar9;
      uVar23 = (uVar60 >> 3 ^
               (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)) + uVar50 +
               uVar53 + (uVar45 >> 10 ^
                        (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
      iVar9 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
              (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
              uVar65 + uVar23 + ((uVar62 ^ uVar33) & uVar59 ^ uVar33) + -0xbf1ca7b;
      uVar12 = uVar12 + iVar9;
      uVar31 = ((uVar27 | uVar61) & uVar52 | uVar27 & uVar61) +
               ((uVar27 * 0x400 | uVar27 >> 0x16) ^
               (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar9;
      uVar43 = (uVar19 >> 3 ^
               (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)) + uVar60 +
               uVar54 + (uVar46 >> 10 ^
                        (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
      iVar9 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
              (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
              uVar33 + uVar43 + ((uVar59 ^ uVar62) & uVar12 ^ uVar62) + 0x106aa070;
      uVar52 = uVar52 + iVar9;
      uVar44 = ((uVar31 | uVar27) & uVar61 | uVar31 & uVar27) +
               ((uVar31 * 0x400 | uVar31 >> 0x16) ^
               (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar9;
      uVar60 = (uVar15 >> 3 ^
               (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7)) + uVar19 +
               uVar56 + (uVar23 >> 10 ^
                        (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
      iVar9 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
              (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
              uVar62 + uVar60 + ((uVar12 ^ uVar59) & uVar52 ^ uVar59) + 0x19a4c116;
      uVar61 = uVar61 + iVar9;
      uVar62 = ((uVar44 | uVar31) & uVar27 | uVar44 & uVar31) +
               ((uVar44 * 0x400 | uVar44 >> 0x16) ^
               (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar9;
      uVar33 = (uVar34 >> 3 ^
               (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7)) + uVar15 +
               uVar10 + (uVar43 >> 10 ^
                        (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
      iVar9 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
              (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
              uVar59 + uVar33 + ((uVar52 ^ uVar12) & uVar61 ^ uVar12) + 0x1e376c08;
      uVar27 = uVar27 + iVar9;
      uVar58 = ((uVar62 | uVar44) & uVar31 | uVar62 & uVar44) +
               ((uVar62 * 0x400 | uVar62 >> 0x16) ^
               (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar9;
      uVar57 = (uVar41 >> 3 ^
               (uVar41 * 0x4000 | uVar41 >> 0x12) ^ (uVar41 * 0x2000000 | uVar41 >> 7)) + uVar34 +
               uVar14 + (uVar60 >> 10 ^
                        (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
      iVar9 = ((uVar27 * 0x80 | uVar27 >> 0x19) ^
              (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) +
              uVar12 + uVar57 + ((uVar61 ^ uVar52) & uVar27 ^ uVar52) + 0x2748774c;
      uVar31 = uVar31 + iVar9;
      uVar19 = ((uVar58 | uVar62) & uVar44 | uVar58 & uVar62) +
               ((uVar58 * 0x400 | uVar58 >> 0x16) ^
               (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar9;
      uVar34 = (uVar48 >> 3 ^
               (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7)) + uVar41 +
               uVar45 + (uVar33 >> 10 ^
                        (uVar33 * 0x2000 | uVar33 >> 0x13) ^ (uVar33 * 0x8000 | uVar33 >> 0x11));
      iVar9 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
              (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
              uVar52 + uVar34 + ((uVar27 ^ uVar61) & uVar31 ^ uVar61) + 0x34b0bcb5;
      uVar44 = uVar44 + iVar9;
      uVar50 = ((uVar19 | uVar58) & uVar62 | uVar19 & uVar58) +
               ((uVar19 * 0x400 | uVar19 >> 0x16) ^
               (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar9;
      uVar41 = (uVar51 >> 3 ^
               (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7)) + uVar48 +
               uVar46 + (uVar57 >> 10 ^
                        (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
      iVar9 = ((uVar44 * 0x80 | uVar44 >> 0x19) ^
              (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
              uVar61 + uVar41 + ((uVar31 ^ uVar27) & uVar44 ^ uVar27) + 0x391c0cb3;
      uVar62 = uVar62 + iVar9;
      uVar15 = ((uVar50 | uVar19) & uVar58 | uVar50 & uVar19) +
               ((uVar50 * 0x400 | uVar50 >> 0x16) ^
               (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar9;
      uVar51 = (uVar29 >> 3 ^
               (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7)) + uVar51 +
               uVar23 + (uVar34 >> 10 ^
                        (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
      iVar9 = ((uVar62 * 0x80 | uVar62 >> 0x19) ^
              (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6)) +
              uVar27 + uVar51 + ((uVar44 ^ uVar31) & uVar62 ^ uVar31) + 0x4ed8aa4a;
      uVar58 = uVar58 + iVar9;
      uVar27 = ((uVar15 | uVar50) & uVar19 | uVar15 & uVar50) +
               ((uVar15 * 0x400 | uVar15 >> 0x16) ^
               (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar9;
      uVar48 = (uVar53 >> 3 ^
               (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7)) + uVar29 +
               uVar43 + (uVar41 >> 10 ^
                        (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11));
      iVar9 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
              (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
              uVar31 + uVar48 + ((uVar62 ^ uVar44) & uVar58 ^ uVar44) + 0x5b9cca4f;
      uVar19 = uVar19 + iVar9;
      uVar61 = ((uVar27 | uVar15) & uVar50 | uVar27 & uVar15) +
               ((uVar27 * 0x400 | uVar27 >> 0x16) ^
               (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar9;
      uVar52 = (uVar54 >> 3 ^
               (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7)) + uVar53 +
               uVar60 + (uVar51 >> 10 ^
                        (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
      iVar9 = ((uVar19 * 0x80 | uVar19 >> 0x19) ^
              (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) +
              uVar44 + uVar52 + ((uVar58 ^ uVar62) & uVar19 ^ uVar62) + 0x682e6ff3;
      uVar50 = uVar50 + iVar9;
      uVar44 = ((uVar61 | uVar27) & uVar15 | uVar61 & uVar27) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar9;
      uVar31 = (uVar56 >> 3 ^
               (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) + uVar54 +
               uVar33 + (uVar48 >> 10 ^
                        (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
      iVar9 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
              (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
              uVar62 + uVar31 + ((uVar19 ^ uVar58) & uVar50 ^ uVar58) + 0x748f82ee;
      uVar15 = uVar15 + iVar9;
      uVar33 = ((uVar44 | uVar61) & uVar27 | uVar44 & uVar61) +
               ((uVar44 * 0x400 | uVar44 >> 0x16) ^
               (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar9;
      uVar12 = (uVar10 >> 3 ^
               (uVar10 * 0x4000 | uVar10 >> 0x12) ^ (uVar10 * 0x2000000 | uVar10 >> 7)) + uVar56 +
               uVar57 + (uVar52 >> 10 ^
                        (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11));
      iVar9 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
              (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
              uVar58 + uVar12 + ((uVar50 ^ uVar19) & uVar15 ^ uVar19) + 0x78a5636f;
      uVar27 = uVar27 + iVar9;
      uVar53 = ((uVar33 | uVar44) & uVar61 | uVar33 & uVar44) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar9;
      uVar34 = (uVar14 >> 3 ^
               (uVar14 * 0x4000 | uVar14 >> 0x12) ^ (uVar14 * 0x2000000 | uVar14 >> 7)) + uVar10 +
               uVar34 + (uVar31 >> 10 ^
                        (uVar31 * 0x2000 | uVar31 >> 0x13) ^ (uVar31 * 0x8000 | uVar31 >> 0x11));
      iVar9 = ((uVar27 * 0x80 | uVar27 >> 0x19) ^
              (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) +
              uVar19 + uVar34 + ((uVar15 ^ uVar50) & uVar27 ^ uVar50) + -0x7b3787ec;
      uVar61 = uVar61 + iVar9;
      uVar29 = ((uVar53 | uVar33) & uVar44 | uVar53 & uVar33) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar9;
      uVar10 = (uVar45 >> 3 ^
               (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) + uVar14 +
               uVar41 + (uVar12 >> 10 ^
                        (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11));
      iVar9 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
              (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
              uVar50 + uVar10 + ((uVar27 ^ uVar15) & uVar61 ^ uVar15) + -0x7338fdf8;
      uVar44 = uVar44 + iVar9;
      uVar12 = ((uVar29 | uVar53) & uVar33 | uVar29 & uVar53) +
               ((uVar29 * 0x400 | uVar29 >> 0x16) ^
               (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar9;
      uVar45 = (uVar46 >> 3 ^
               (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) + uVar45 +
               uVar51 + (uVar34 >> 10 ^
                        (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
      iVar9 = ((uVar44 * 0x80 | uVar44 >> 0x19) ^
              (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
              uVar15 + uVar45 + ((uVar61 ^ uVar27) & uVar44 ^ uVar27) + -0x6f410006;
      uVar33 = uVar33 + iVar9;
      uVar34 = ((uVar12 | uVar29) & uVar53 | uVar12 & uVar29) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar9;
      uVar14 = (uVar23 >> 3 ^
               (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) + uVar46 +
               uVar48 + (uVar10 >> 10 ^
                        (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
      iVar9 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
              (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
              uVar27 + uVar14 + ((uVar44 ^ uVar61) & uVar33 ^ uVar61) + -0x5baf9315;
      uVar53 = uVar53 + iVar9;
      uVar10 = ((uVar34 | uVar12) & uVar29 | uVar34 & uVar12) +
               ((uVar34 * 0x400 | uVar34 >> 0x16) ^
               (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar9;
      iVar9 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7)
              ) + uVar23 + uVar52 +
              (uVar45 >> 10 ^
              (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11)) + uVar61 +
              ((uVar33 ^ uVar44) & uVar53 ^ uVar44) +
              ((uVar53 * 0x80 | uVar53 >> 0x19) ^
              (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
              -0x41065c09;
      uVar29 = uVar29 + iVar9;
      uVar61 = ((uVar10 | uVar34) & uVar12 | uVar10 & uVar34) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar9;
      iVar9 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
              (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
              (uVar60 >> 3 ^ (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)
              ) + uVar43 + uVar31 +
              (uVar14 >> 10 ^
              (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11)) + uVar44 +
              ((uVar53 ^ uVar33) & uVar29 ^ uVar33) + -0x398e870e;
      hash->s[0] = ((uVar61 | uVar10) & uVar34 | uVar61 & uVar10) + uVar1 +
                   ((uVar61 * 0x400 | uVar61 >> 0x16) ^
                   (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar9
      ;
      hash->s[1] = uVar61 + uVar2;
      hash->s[2] = uVar10 + uVar3;
      hash->s[3] = uVar34 + uVar4;
      hash->s[4] = uVar12 + uVar5 + iVar9;
      hash->s[5] = uVar29 + uVar6;
      hash->s[6] = uVar53 + uVar7;
      hash->s[7] = uVar33 + uVar8;
      uVar32 = 0;
    } while (0x3f < len);
  }
  if (len == 0) {
    return;
  }
  memcpy((void *)((long)hash->buf + local_b8),data,len);
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    while (bufsize + len >= 64) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(((unsigned char*)hash->buf) + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(((unsigned char*)hash->buf) + bufsize, data, len);
    }
}